

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

void __thiscall
GrcErrorList::AddItem
          (GrcErrorList *this,bool fFatal,int nID,GdlObject *pgdlObj,GrpLineAndFile *plnf,
          string *staMsg)

{
  pointer *pppGVar1;
  pointer pcVar2;
  iterator __position;
  GrcErrorItem *this_00;
  GrpLineAndFile lnf;
  GrcErrorItem *perr;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  GrcErrorItem *local_78;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_a0._0_4_ = 0;
  local_a0._4_4_ = 0;
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((plnf != (GrpLineAndFile *)0x0) || (plnf = &pgdlObj->m_lnf, pgdlObj != (GdlObject *)0x0)) {
    local_a0._0_4_ = plnf->m_nLinePre;
    local_a0._4_4_ = plnf->m_nLineOrig;
    std::__cxx11::string::_M_assign((string *)&local_98);
  }
  this_00 = (GrcErrorItem *)operator_new(0x60);
  pcVar2 = (staMsg->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + staMsg->_M_string_length);
  GrcErrorItem::GrcErrorItem(this_00,fFatal,nID,(GrpLineAndFile *)local_a0,&local_70,pgdlObj);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __position._M_current =
       (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = this_00;
  if (__position._M_current ==
      (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<GrcErrorItem*,std::allocator<GrcErrorItem*>>::_M_realloc_insert<GrcErrorItem*const&>
              ((vector<GrcErrorItem*,std::allocator<GrcErrorItem*>> *)&this->m_vperr,__position,
               &local_78);
  }
  else {
    *__position._M_current = this_00;
    pppGVar1 = &(this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppGVar1 = *pppGVar1 + 1;
  }
  if (fFatal) {
    this->m_fFatalError = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GrcErrorList::AddItem(bool fFatal, int nID, GdlObject * pgdlObj, const GrpLineAndFile * plnf,
	std::string staMsg)
{
	GrpLineAndFile lnf(0, 0, "");
	if (plnf == NULL)
	{
		if (pgdlObj)
			lnf = pgdlObj->LineAndFile();
	}
	else
		lnf = *plnf;
	
	GrcErrorItem * perr = new GrcErrorItem(fFatal, nID, lnf, staMsg, pgdlObj);
	m_vperr.push_back(perr);

	if (fFatal)
		m_fFatalError = true;
}